

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cborencoder.c
# Opt level: O0

CborError cbor_encoder_close_container(CborEncoder *parentEncoder,CborEncoder *containerEncoder)

{
  CborError CVar1;
  undefined8 *in_RSI;
  CborEncoder *in_RDI;
  undefined4 in_stack_fffffffffffffffc;
  
  in_RDI->end = (uint8_t *)in_RSI[1];
  (in_RDI->data).ptr = (uint8_t *)*in_RSI;
  if ((*(uint *)(in_RSI + 3) & 0x10) == 0) {
    if (in_RSI[2] == 1) {
      if (in_RDI->end == (uint8_t *)0x0) {
        CVar1 = CborErrorOutOfMemory;
      }
      else {
        CVar1 = CborNoError;
      }
    }
    else {
      CVar1 = CborErrorTooFewItems;
      if (in_RSI[2] == 0) {
        CVar1 = CborErrorTooManyItems;
      }
    }
  }
  else {
    CVar1 = append_byte_to_buffer(in_RDI,(uint8_t)((uint)in_stack_fffffffffffffffc >> 0x18));
  }
  return CVar1;
}

Assistant:

CborError cbor_encoder_close_container(CborEncoder *parentEncoder, const CborEncoder *containerEncoder)
{
    // synchronise buffer state with that of the container
    parentEncoder->end = containerEncoder->end;
    parentEncoder->data = containerEncoder->data;

    if (containerEncoder->flags & CborIteratorFlag_UnknownLength)
        return append_byte_to_buffer(parentEncoder, BreakByte);

    if (containerEncoder->remaining != 1)
        return containerEncoder->remaining == 0 ? CborErrorTooManyItems : CborErrorTooFewItems;

    if (!parentEncoder->end)
        return CborErrorOutOfMemory;    /* keep the state */

    return CborNoError;
}